

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePathCommand.cxx
# Opt level: O0

void __thiscall
anon_unknown.dwarf_6dbcfe::ArgumentParserWithOutputVariable<Arguments>::
ArgumentParserWithOutputVariable(ArgumentParserWithOutputVariable<Arguments> *this)

{
  static_string_view name;
  ArgumentParserWithOutputVariable<Arguments> *this_local;
  
  CMakePathArgumentParser<Arguments>::CMakePathArgumentParser
            (&this->super_CMakePathArgumentParser<Arguments>);
  name = ::cm::operator____s("OUTPUT_VARIABLE",0xf);
  (anonymous_namespace)::
  ArgumentParserWithOutputVariable<(anonymous_namespace)::HandleReplaceExtensionCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
  ::Bind<std::optional<ArgumentParser::NonEmpty<std::__cxx11::string>>>
            ((ArgumentParserWithOutputVariable<(anonymous_namespace)::HandleReplaceExtensionCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
              *)this,name,0x30);
  return;
}

Assistant:

ArgumentParserWithOutputVariable()
    : CMakePathArgumentParser<Result>()
  {
    this->Bind("OUTPUT_VARIABLE"_s, &Result::Output);
  }